

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

string * Rdbuf(string *__return_storage_ptr__,string *FileName)

{
  ostringstream Results;
  ifstream ResultReader;
  ostringstream aoStack_388 [112];
  ios_base local_318 [264];
  undefined1 local_210 [16];
  streambuf local_200 [504];
  
  std::ifstream::ifstream(local_210,(string *)FileName,_S_in);
  std::__cxx11::ostringstream::ostringstream(aoStack_388);
  std::ostream::operator<<((ostream *)aoStack_388,local_200);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_388);
  std::ios_base::~ios_base(local_318);
  std::ifstream::~ifstream(local_210);
  return __return_storage_ptr__;
}

Assistant:

std::string Rdbuf(std::string FileName)
{
    std::ifstream ResultReader(FileName);
    std::ostringstream Results;
    Results << ResultReader.rdbuf();
    return Results.str();
}